

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

int __thiscall HighFreqSub::registerDataType(HighFreqSub *this,HighFreqDataType *hf)

{
  int iVar1;
  char *pcVar2;
  zsock_t *pzVar3;
  HighFreqDataType *in_RDI;
  char *recv;
  HighFreqDataType *in_stack_ffffffffffffff88;
  string local_38 [52];
  int local_4;
  
  HighFreqDataType::operator=(in_RDI,in_stack_ffffffffffffff88);
  HighFreqDataType::getSockAddr_abi_cxx11_(in_stack_ffffffffffffff88);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pzVar3 = zsock_new_sub_checked
                     (pcVar2,"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                      ,0x53);
  in_RDI[1].name.field_2._M_allocated_capacity = (size_type)pzVar3;
  std::__cxx11::string::~string(local_38);
  if (in_RDI[1].name.field_2._M_allocated_capacity == 0) {
    local_4 = -1;
  }
  else {
    zsock_set_rcvhwm((void *)in_RDI[1].name.field_2._M_allocated_capacity,100);
    if (*(long *)&in_RDI[1].name == 0) {
      local_4 = 0;
    }
    else {
      zstr_send(*(void **)&in_RDI[1].name,"$REG");
      pcVar2 = zstr_recv(*(void **)&in_RDI[1].name);
      iVar1 = strcmp(pcVar2,"$REGD");
      if (iVar1 == 0) {
        free(pcVar2);
        local_4 = 0;
      }
      else {
        free(pcVar2);
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int HighFreqSub::registerDataType(HighFreqDataType hf){
    dt = hf;
    sub = zsock_new_sub(dt.getSockAddr().c_str(), "");
    if(!sub){
        return -1;
    }
//    registered = true;
    zsock_set_rcvhwm(sub, 100);
    if(actor){
        zstr_send(actor, regdt);
        char *recv = zstr_recv(actor);
        if(streq(recv, regdone)){
            freen(recv);
            return 0;
        }else{
            freen(recv);
            return -1;
        }
    }
    return 0;
}